

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::ReadCmdFromProcessPipe
          (CPalSynchronizationManager *this,int iPollTimeout,SynchWorkerCmd *pswcWorkerCmd,
          SHMPTR *pshridMarshaledData,DWORD *pdwData)

{
  int *piVar1;
  DWORD local_4c;
  undefined8 uStack_48;
  DWORD dwData;
  SHMPTR shridMarshaledId;
  SynchWorkerCmd swcWorkerCmd;
  PAL_ERROR PStack_34;
  BYTE byVal;
  int iRet;
  PAL_ERROR palErr;
  DWORD *pdwData_local;
  SHMPTR *pshridMarshaledData_local;
  SynchWorkerCmd *pswcWorkerCmd_local;
  CPalSynchronizationManager *pCStack_10;
  int iPollTimeout_local;
  CPalSynchronizationManager *this_local;
  
  PStack_34 = 0;
  shridMarshaledId._0_4_ = 0;
  _iRet = pdwData;
  pdwData_local = (DWORD *)pshridMarshaledData;
  pshridMarshaledData_local = (SHMPTR *)pswcWorkerCmd;
  pswcWorkerCmd_local._4_4_ = iPollTimeout;
  pCStack_10 = this;
  if (pswcWorkerCmd == (SynchWorkerCmd *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x6e3);
    fprintf(_stderr,"Expression: NULL != pswcWorkerCmd\n");
  }
  if (pdwData_local == (DWORD *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x6e4);
    fprintf(_stderr,"Expression: NULL != pshridMarshaledData\n");
  }
  if (_iRet == (DWORD *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x6e5);
    fprintf(_stderr,"Expression: NULL != pdwData\n");
  }
  swcWorkerCmd = ReadBytesFromProcessPipe
                           (this,pswcWorkerCmd_local._4_4_,(BYTE *)((long)&shridMarshaledId + 7),1);
  if ((int)swcWorkerCmd < 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    piVar1 = __errno_location();
    strerror(*piVar1);
    PStack_34 = 0x54f;
  }
  else {
    if (swcWorkerCmd != SynchWorkerCmdNop) {
      if (swcWorkerCmd != SynchWorkerCmdRemoteSignal) {
        fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x6f5);
        fprintf(_stderr,
                "Expression: sizeof(BYTE) == iRet, Description: Got %d bytes from process pipe while expecting for %d\n"
                ,(ulong)swcWorkerCmd,1);
      }
      shridMarshaledId._0_4_ = (uint)shridMarshaledId._7_1_;
      if (3 < (uint)shridMarshaledId) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        PStack_34 = 0x54f;
        goto LAB_003c2272;
      }
      if (((((uint)shridMarshaledId != 0) && ((uint)shridMarshaledId != 1)) &&
          ((uint)shridMarshaledId != 2)) && ((uint)shridMarshaledId != 3)) {
        fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x705);
        fprintf(_stderr,
                "Expression: SynchWorkerCmdNop == swcWorkerCmd || SynchWorkerCmdRemoteSignal == swcWorkerCmd || SynchWorkerCmdDelegatedObjectSignaling == swcWorkerCmd || SynchWorkerCmdShutdown == swcWorkerCmd, Description: Unknown WrkrCmd=%u\n"
                ,(ulong)(uint)shridMarshaledId);
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    if (((uint)shridMarshaledId == 1) || ((uint)shridMarshaledId == 2)) {
      uStack_48 = 0;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      swcWorkerCmd = ReadBytesFromProcessPipe(this,0xfa,(BYTE *)&stack0xffffffffffffffb8,8);
      if (swcWorkerCmd != 8) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        piVar1 = __errno_location();
        strerror(*piVar1);
        PStack_34 = 0x54f;
        goto LAB_003c2272;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      *(undefined8 *)pdwData_local = uStack_48;
      swcWorkerCmd = 8;
    }
    if ((uint)shridMarshaledId == 2) {
      swcWorkerCmd = ReadBytesFromProcessPipe(this,0xfa,(BYTE *)&local_4c,4);
      if (swcWorkerCmd == SynchWorkerCmdLast) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        *_iRet = local_4c;
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        piVar1 = __errno_location();
        strerror(*piVar1);
        PStack_34 = 0x54f;
      }
    }
  }
LAB_003c2272:
  if (PStack_34 == 0) {
    *(uint *)pshridMarshaledData_local = (uint)shridMarshaledId;
  }
  return PStack_34;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::ReadCmdFromProcessPipe(
        int iPollTimeout,
        SynchWorkerCmd * pswcWorkerCmd,
        SharedID * pshridMarshaledData,
        DWORD * pdwData)
    {
        PAL_ERROR palErr = NO_ERROR;
        int iRet;
        BYTE byVal;
        SynchWorkerCmd swcWorkerCmd = SynchWorkerCmdNop;

        _ASSERTE(NULL != pswcWorkerCmd);
        _ASSERTE(NULL != pshridMarshaledData);
        _ASSERTE(NULL != pdwData);

        iRet = ReadBytesFromProcessPipe(iPollTimeout, &byVal, sizeof(BYTE));

        if (0 > iRet)
        {
            ERROR("Failed polling the process pipe [ret=%d errno=%d (%s)]\n",
                  iRet, errno, strerror(errno));
            palErr = ERROR_INTERNAL_ERROR;
            goto RCFPP_exit;
        }

        if (iRet != 0)
        {
            _ASSERT_MSG(sizeof(BYTE) == iRet,
                        "Got %d bytes from process pipe while expecting for %d\n",
                        iRet, sizeof(BYTE));

            swcWorkerCmd = (SynchWorkerCmd)byVal;

            if(SynchWorkerCmdLast <= swcWorkerCmd)
            {
                ERROR("Got unknown worker command code %d from the process "
                       "pipe!\n", swcWorkerCmd);
                palErr = ERROR_INTERNAL_ERROR;
                goto RCFPP_exit;
            }

            _ASSERT_MSG(SynchWorkerCmdNop == swcWorkerCmd ||
                        SynchWorkerCmdRemoteSignal == swcWorkerCmd ||
                        SynchWorkerCmdDelegatedObjectSignaling == swcWorkerCmd ||
                        SynchWorkerCmdShutdown == swcWorkerCmd,
                        "Unknown WrkrCmd=%u\n", swcWorkerCmd);

            TRACE("Got cmd %u from process pipe\n", swcWorkerCmd);
        }

        if (SynchWorkerCmdRemoteSignal == swcWorkerCmd ||
            SynchWorkerCmdDelegatedObjectSignaling == swcWorkerCmd)
        {
            SharedID shridMarshaledId = NULLSharedID;

            TRACE("Received %s cmd\n",
                  (swcWorkerCmd == SynchWorkerCmdRemoteSignal) ?
                  "REMOTE SIGNAL" : "DELEGATED OBJECT SIGNALING" );

            iRet = ReadBytesFromProcessPipe(WorkerCmdCompletionTimeout,
                                            (BYTE *)&shridMarshaledId,
                                            sizeof(shridMarshaledId));
            if (sizeof(shridMarshaledId) != iRet)
            {
                ERROR("Unable to read marshaled Shared ID from the "
                      "process pipe [pipe=%d ret=%d errno=%d (%s)]\n",
                      m_iProcessPipeRead, iRet, errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
                goto RCFPP_exit;
            }

            TRACE("Received marshaled shrid=%p\n", (VOID *)shridMarshaledId);

            *pshridMarshaledData = shridMarshaledId;
        }

        if (SynchWorkerCmdDelegatedObjectSignaling == swcWorkerCmd)
        {
            DWORD dwData;

            iRet = ReadBytesFromProcessPipe(WorkerCmdCompletionTimeout,
                                            (BYTE *)&dwData,
                                            sizeof(dwData));
            if (sizeof(dwData) != iRet)
            {
                ERROR("Unable to read signal count from the "
                      "process pipe [pipe=%d ret=%d errno=%d (%s)]\n",
                      m_iProcessPipeRead, iRet, errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
                goto RCFPP_exit;
            }

            TRACE("Received signal count %u\n", dwData);

            *pdwData = dwData;
        }

    RCFPP_exit:
        if (NO_ERROR == palErr)
        {
            *pswcWorkerCmd = swcWorkerCmd;
        }
        return palErr;
    }